

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_true>_>,_false>
::intersect(BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_true>_>,_false>
            *this,vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  RayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  size_t bits;
  uint uVar13;
  ulong uVar14;
  code *pcVar15;
  undefined4 uVar16;
  ulong uVar17;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar18;
  long lVar19;
  RayQueryContext *pRVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  RayQueryContext *pRVar22;
  NodeRef *pNVar23;
  long lVar24;
  bool bVar25;
  float fVar26;
  float fVar36;
  float fVar37;
  vint4 ai;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar38;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar41;
  undefined1 auVar39 [16];
  float fVar42;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar40;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar48;
  float fVar49;
  vfloat_impl<4> __tmp_1;
  float fVar50;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar46;
  undefined1 auVar47 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  vint4 ai_1;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar61;
  float fVar62;
  vint4 ai_3;
  undefined1 auVar60 [16];
  float fVar63;
  float fVar64;
  float fVar66;
  float fVar67;
  vint4 bi;
  undefined1 auVar65 [16];
  float fVar68;
  float fVar69;
  float fVar72;
  float fVar73;
  float fVar74;
  vint4 bi_3;
  float fVar75;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar76;
  float fVar77;
  float fVar79;
  float fVar80;
  vint4 bi_1;
  undefined1 auVar78 [16];
  float fVar81;
  uint uVar82;
  float fVar85;
  uint uVar87;
  vint4 ai_2;
  float fVar88;
  undefined1 auVar83 [16];
  uint uVar86;
  uint uVar89;
  undefined1 auVar84 [16];
  uint uVar90;
  uint uVar92;
  uint uVar93;
  vint4 bi_2;
  undefined1 auVar91 [16];
  uint uVar94;
  float fVar96;
  undefined1 auVar95 [16];
  float fVar97;
  float fVar98;
  float fVar100;
  float fVar101;
  undefined1 in_XMM12 [16];
  undefined1 auVar99 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 in_XMM13 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 in_XMM14 [16];
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 local_17e8 [8];
  float fStack_17e0;
  float fStack_17dc;
  undefined1 local_17b8 [16];
  vint<4> *local_17a0;
  undefined8 local_1798;
  undefined4 local_1790;
  undefined8 local_1788;
  Intersectors *local_1780;
  undefined4 local_1778;
  uint local_1774;
  long local_1770;
  undefined8 local_1768;
  long local_1760;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1708;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  lVar19 = (valid_i->field_0).v[0];
  pRVar22 = *(RayQueryContext **)(lVar19 + 0x70);
  if (pRVar22 != (RayQueryContext *)0x8) {
    auVar32._8_4_ = 0xffffffff;
    auVar32._0_8_ = 0xffffffffffffffff;
    auVar32._12_4_ = 0xffffffff;
    auVar65._0_4_ = -(uint)(*(int *)this == -1);
    auVar65._4_4_ = -(uint)(*(int *)(this + 4) == -1);
    auVar65._8_4_ = -(uint)(*(int *)(this + 8) == -1);
    auVar65._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
    iVar12 = movmskps((int)lVar19,auVar65);
    uVar14 = CONCAT44((int)((ulong)lVar19 >> 0x20),iVar12);
    if (iVar12 != 0) {
      auVar71._0_8_ = (This->intersector4).intersect;
      auVar71._8_8_ = (This->intersector4).occluded;
      fVar72 = (float)((ulong)auVar71._0_8_ >> 0x20);
      fVar75 = (float)((ulong)auVar71._8_8_ >> 0x20);
      fVar51 = (float)DAT_01f80d30;
      fVar53 = DAT_01f80d30._4_4_;
      fVar55 = DAT_01f80d30._8_4_;
      fVar57 = DAT_01f80d30._12_4_;
      auVar60._4_4_ = -(uint)(ABS(fVar72) < fVar53);
      auVar60._0_4_ = -(uint)(ABS((float)auVar71._0_8_) < fVar51);
      auVar60._8_4_ = -(uint)(ABS((float)auVar71._8_8_) < fVar55);
      auVar60._12_4_ = -(uint)(ABS(fVar75) < fVar57);
      auVar60 = blendvps(auVar71,_DAT_01f80d30,auVar60);
      auVar3 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar91._4_4_ = -(uint)(ABS(auVar3._4_4_) < fVar53);
      auVar91._0_4_ = -(uint)(ABS(auVar3._0_4_) < fVar51);
      auVar91._8_4_ = -(uint)(ABS(auVar3._8_4_) < fVar55);
      auVar91._12_4_ = -(uint)(ABS(auVar3._12_4_) < fVar57);
      auVar91 = blendvps(auVar3,_DAT_01f80d30,auVar91);
      auVar4._0_8_ = (This->intersector4_filter).occluded;
      auVar4._8_8_ = (This->intersector4_filter).name;
      fVar85 = (float)((ulong)auVar4._0_8_ >> 0x20);
      fVar88 = (float)((ulong)auVar4._8_8_ >> 0x20);
      auVar95._4_4_ = -(uint)(ABS(fVar85) < fVar53);
      auVar95._0_4_ = -(uint)(ABS((float)auVar4._0_8_) < fVar51);
      auVar95._8_4_ = -(uint)(ABS((float)auVar4._8_8_) < fVar55);
      auVar95._12_4_ = -(uint)(ABS(fVar88) < fVar57);
      auVar95 = blendvps(auVar4,_DAT_01f80d30,auVar95);
      auVar99 = rcpps(in_XMM12,auVar60);
      fVar98 = auVar99._0_4_;
      fVar100 = auVar99._4_4_;
      fVar101 = auVar99._8_4_;
      fVar102 = auVar99._12_4_;
      auVar99 = rcpps(in_XMM13,auVar91);
      fVar103 = auVar99._0_4_;
      fVar104 = auVar99._4_4_;
      fVar105 = auVar99._8_4_;
      fVar106 = auVar99._12_4_;
      auVar99 = rcpps(in_XMM14,auVar95);
      fVar107 = auVar99._0_4_;
      fVar108 = auVar99._4_4_;
      fVar109 = auVar99._8_4_;
      fVar110 = auVar99._12_4_;
      auVar99._0_12_ = ZEXT812(0);
      auVar99._12_4_ = 0;
      auVar70._0_8_ =
           CONCAT44(-(uint)(fVar72 < 0.0),-(uint)((float)auVar71._0_8_ < 0.0)) & 0x100000001;
      auVar70._8_4_ = -(uint)((float)auVar71._8_8_ < 0.0) & 1;
      auVar70._12_4_ = -(uint)(fVar75 < 0.0) & 1;
      auVar78._0_8_ =
           CONCAT44(-(uint)(auVar3._4_4_ < 0.0),-(uint)(auVar3._0_4_ < 0.0)) & 0x200000002;
      auVar78._8_4_ = -(uint)(auVar3._8_4_ < 0.0) & 2;
      auVar78._12_4_ = -(uint)(auVar3._12_4_ < 0.0) & 2;
      auVar71 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,auVar99);
      fVar72 = *(float *)&This->ptr;
      fVar75 = *(float *)((long)&This->ptr + 4);
      fVar96 = *(float *)&This->leafIntersector;
      fVar97 = *(float *)((long)&This->leafIntersector + 4);
      fVar51 = *(float *)&(This->collider).collide;
      fVar53 = *(float *)((long)&(This->collider).collide + 4);
      fVar55 = *(float *)&(This->collider).name;
      fVar57 = *(float *)((long)&(This->collider).name + 4);
      auVar83._0_8_ =
           CONCAT44(-(uint)(fVar85 < 0.0),-(uint)((float)auVar4._0_8_ < 0.0)) & 0x400000004;
      auVar83._8_4_ = -(uint)((float)auVar4._8_8_ < 0.0) & 4;
      auVar83._12_4_ = -(uint)(fVar88 < 0.0) & 4;
      local_16f8 = (This->intersector1).intersect;
      uStack_16f0 = (This->intersector1).occluded;
      local_17b8 = auVar65 ^ auVar32 | auVar83 | auVar78 | auVar70;
      auVar3._0_8_ = (This->intersector1).pointQuery;
      auVar3._8_8_ = (This->intersector1).name;
      do {
        lVar19 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
          }
        }
        iVar12 = *(int *)(local_17b8 + lVar19 * 4);
        auVar27._0_4_ = -(uint)(iVar12 == local_17b8._0_4_);
        auVar27._4_4_ = -(uint)(iVar12 == local_17b8._4_4_);
        auVar27._8_4_ = -(uint)(iVar12 == local_17b8._8_4_);
        auVar27._12_4_ = -(uint)(iVar12 == local_17b8._12_4_);
        uVar16 = movmskps((int)lVar19,auVar27);
        uVar17 = ~CONCAT44((int)((ulong)lVar19 >> 0x20),uVar16);
        uVar14 = uVar14 & uVar17;
      } while (uVar14 != 0);
      local_17b8._8_4_ = 0xffffffff;
      local_17b8._0_8_ = 0xffffffffffffffff;
      local_17b8._12_4_ = 0xffffffff;
      auVar39._0_4_ = -(uint)(*(int *)this == -1);
      auVar39._4_4_ = -(uint)(*(int *)(this + 4) == -1);
      auVar39._8_4_ = -(uint)(*(int *)(this + 8) == -1);
      auVar39._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
      auVar65 = maxps(auVar3,ZEXT816(0));
      local_1708.v = (__m128)blendvps(_DAT_01f7a9f0,auVar65,auVar39);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = (size_t)pRVar22;
      stack_near[1].field_0 = local_1708;
      if (pRVar22 != (RayQueryContext *)&DAT_fffffffffffffff8) {
        fVar98 = fVar98 + (1.0 - auVar60._0_4_ * fVar98) * fVar98;
        fVar100 = fVar100 + (1.0 - auVar60._4_4_ * fVar100) * fVar100;
        fVar101 = fVar101 + (1.0 - auVar60._8_4_ * fVar101) * fVar101;
        fVar102 = fVar102 + (1.0 - auVar60._12_4_ * fVar102) * fVar102;
        fVar103 = fVar103 + (1.0 - auVar91._0_4_ * fVar103) * fVar103;
        fVar104 = fVar104 + (1.0 - auVar91._4_4_ * fVar104) * fVar104;
        fVar105 = fVar105 + (1.0 - auVar91._8_4_ * fVar105) * fVar105;
        fVar106 = fVar106 + (1.0 - auVar91._12_4_ * fVar106) * fVar106;
        fVar107 = fVar107 + (1.0 - auVar95._0_4_ * fVar107) * fVar107;
        fVar108 = fVar108 + (1.0 - auVar95._4_4_ * fVar108) * fVar108;
        fVar109 = fVar109 + (1.0 - auVar95._8_4_ * fVar109) * fVar109;
        fVar110 = fVar110 + (1.0 - auVar95._12_4_ * fVar110) * fVar110;
        pNVar23 = stack_node + 1;
        _local_17e8 = blendvps(_DAT_01f7aa00,auVar71,auVar39);
        paVar18 = &stack_near[2].field_0;
        local_1718 = fVar98;
        fStack_1714 = fVar100;
        fStack_1710 = fVar101;
        fStack_170c = fVar102;
        local_1728 = fVar103;
        fStack_1724 = fVar104;
        fStack_1720 = fVar105;
        fStack_171c = fVar106;
        local_1738 = fVar107;
        fStack_1734 = fVar108;
        fStack_1730 = fVar109;
        fStack_172c = fVar110;
        local_1748 = fVar72;
        fStack_1744 = fVar75;
        fStack_1740 = fVar96;
        fStack_173c = fVar97;
        local_1758 = fVar51;
        fStack_1754 = fVar53;
        fStack_1750 = fVar55;
        fStack_174c = fVar57;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar17;
        auVar111 = auVar11 << 0x40;
        do {
          uVar14 = auVar111._8_8_;
          aVar46 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18[-1].v;
          paVar18 = paVar18 + -1;
          auVar28._4_4_ = -(uint)(aVar46.v[1] < (float)local_17e8._4_4_);
          auVar28._0_4_ = -(uint)(aVar46.v[0] < (float)local_17e8._0_4_);
          auVar28._8_4_ = -(uint)(aVar46.v[2] < fStack_17e0);
          auVar28._12_4_ = -(uint)(aVar46._12_4_ < fStack_17dc);
          uVar13 = movmskps(auVar111._0_4_,auVar28);
          uVar17 = CONCAT44(0,uVar13);
          auVar111._8_8_ = uVar14;
          auVar111._0_8_ = uVar17;
          if (uVar13 != 0) {
            while( true ) {
              fVar85 = aVar46.v[0];
              fVar88 = aVar46.v[1];
              fVar41 = aVar46.v[2];
              fVar42 = aVar46.v[3];
              if (((ulong)pRVar22 & 8) != 0) break;
              uVar21 = (ulong)pRVar22 & 0xfffffffffffffff0;
              uVar13 = (uint)pRVar22 & 7;
              uVar14 = (ulong)uVar13;
              uVar17 = 0;
              lVar19 = -0x10;
              pRVar22 = (RayQueryContext *)0x8;
              aVar40 = _DAT_01f7a9f0;
              do {
                pRVar6 = *(RayQueryContext **)(uVar21 + 0x20 + lVar19 * 2);
                aVar46 = aVar40;
                if (pRVar6 == (RayQueryContext *)0x8) break;
                fVar38 = *(float *)(uVar21 + 0x90 + lVar19);
                fVar52 = *(float *)(uVar21 + 0x30 + lVar19);
                fVar68 = *(float *)(uVar21 + 0x40 + lVar19);
                fVar58 = *(float *)(uVar21 + 0x50 + lVar19);
                fVar69 = *(float *)(uVar21 + 0x60 + lVar19);
                uVar2 = (This->intersector4_nofilter).intersect;
                uVar5 = (This->intersector4_nofilter).occluded;
                fVar45 = (float)uVar2;
                fVar48 = (float)((ulong)uVar2 >> 0x20);
                fVar49 = (float)uVar5;
                fVar50 = (float)((ulong)uVar5 >> 0x20);
                fVar59 = *(float *)(uVar21 + 0xb0 + lVar19);
                fVar63 = *(float *)(uVar21 + 0xd0 + lVar19);
                fVar64 = *(float *)(uVar21 + 0x70 + lVar19);
                fVar73 = *(float *)(uVar21 + 0xa0 + lVar19);
                fVar74 = *(float *)(uVar21 + 0xc0 + lVar19);
                fVar76 = *(float *)(uVar21 + 0xe0 + lVar19);
                fVar1 = *(float *)(uVar21 + 0x80 + lVar19);
                fVar26 = ((fVar38 * fVar45 + fVar52) - fVar72) * fVar98;
                fVar36 = ((fVar38 * fVar48 + fVar52) - fVar75) * fVar100;
                fVar37 = ((fVar38 * fVar49 + fVar52) - fVar96) * fVar101;
                fVar38 = ((fVar38 * fVar50 + fVar52) - fVar97) * fVar102;
                fVar52 = ((fVar59 * fVar45 + fVar58) - fVar51) * fVar103;
                fVar54 = ((fVar59 * fVar48 + fVar58) - fVar53) * fVar104;
                fVar56 = ((fVar59 * fVar49 + fVar58) - fVar55) * fVar105;
                fVar58 = ((fVar59 * fVar50 + fVar58) - fVar57) * fVar106;
                fVar59 = ((fVar63 * fVar45 + fVar64) - (float)local_16f8) * fVar107;
                fVar61 = ((fVar63 * fVar48 + fVar64) - local_16f8._4_4_) * fVar108;
                fVar62 = ((fVar63 * fVar49 + fVar64) - (float)uStack_16f0) * fVar109;
                fVar63 = ((fVar63 * fVar50 + fVar64) - uStack_16f0._4_4_) * fVar110;
                fVar64 = ((fVar73 * fVar45 + fVar68) - fVar72) * fVar98;
                fVar66 = ((fVar73 * fVar48 + fVar68) - fVar75) * fVar100;
                fVar67 = ((fVar73 * fVar49 + fVar68) - fVar96) * fVar101;
                fVar68 = ((fVar73 * fVar50 + fVar68) - fVar97) * fVar102;
                fVar77 = ((fVar74 * fVar45 + fVar69) - fVar51) * fVar103;
                fVar79 = ((fVar74 * fVar48 + fVar69) - fVar53) * fVar104;
                fVar80 = ((fVar74 * fVar49 + fVar69) - fVar55) * fVar105;
                fVar81 = ((fVar74 * fVar50 + fVar69) - fVar57) * fVar106;
                fVar69 = ((fVar76 * fVar45 + fVar1) - (float)local_16f8) * fVar107;
                fVar73 = ((fVar76 * fVar48 + fVar1) - local_16f8._4_4_) * fVar108;
                fVar74 = ((fVar76 * fVar49 + fVar1) - (float)uStack_16f0) * fVar109;
                fVar76 = ((fVar76 * fVar50 + fVar1) - uStack_16f0._4_4_) * fVar110;
                uVar82 = (uint)((int)fVar64 < (int)fVar26) * (int)fVar64 |
                         (uint)((int)fVar64 >= (int)fVar26) * (int)fVar26;
                uVar86 = (uint)((int)fVar66 < (int)fVar36) * (int)fVar66 |
                         (uint)((int)fVar66 >= (int)fVar36) * (int)fVar36;
                uVar87 = (uint)((int)fVar67 < (int)fVar37) * (int)fVar67 |
                         (uint)((int)fVar67 >= (int)fVar37) * (int)fVar37;
                uVar89 = (uint)((int)fVar68 < (int)fVar38) * (int)fVar68 |
                         (uint)((int)fVar68 >= (int)fVar38) * (int)fVar38;
                uVar90 = (uint)((int)fVar77 < (int)fVar52) * (int)fVar77 |
                         (uint)((int)fVar77 >= (int)fVar52) * (int)fVar52;
                uVar92 = (uint)((int)fVar79 < (int)fVar54) * (int)fVar79 |
                         (uint)((int)fVar79 >= (int)fVar54) * (int)fVar54;
                uVar93 = (uint)((int)fVar80 < (int)fVar56) * (int)fVar80 |
                         (uint)((int)fVar80 >= (int)fVar56) * (int)fVar56;
                uVar94 = (uint)((int)fVar81 < (int)fVar58) * (int)fVar81 |
                         (uint)((int)fVar81 >= (int)fVar58) * (int)fVar58;
                uVar90 = ((int)uVar90 < (int)uVar82) * uVar82 |
                         ((int)uVar90 >= (int)uVar82) * uVar90;
                uVar92 = ((int)uVar92 < (int)uVar86) * uVar86 |
                         ((int)uVar92 >= (int)uVar86) * uVar92;
                uVar93 = ((int)uVar93 < (int)uVar87) * uVar87 |
                         ((int)uVar93 >= (int)uVar87) * uVar93;
                uVar94 = ((int)uVar94 < (int)uVar89) * uVar89 |
                         ((int)uVar94 >= (int)uVar89) * uVar94;
                uVar82 = (uint)((int)fVar69 < (int)fVar59) * (int)fVar69 |
                         (uint)((int)fVar69 >= (int)fVar59) * (int)fVar59;
                uVar86 = (uint)((int)fVar73 < (int)fVar61) * (int)fVar73 |
                         (uint)((int)fVar73 >= (int)fVar61) * (int)fVar61;
                uVar87 = (uint)((int)fVar74 < (int)fVar62) * (int)fVar74 |
                         (uint)((int)fVar74 >= (int)fVar62) * (int)fVar62;
                uVar89 = (uint)((int)fVar76 < (int)fVar63) * (int)fVar76 |
                         (uint)((int)fVar76 >= (int)fVar63) * (int)fVar63;
                auVar84._0_4_ =
                     ((int)uVar82 < (int)uVar90) * uVar90 | ((int)uVar82 >= (int)uVar90) * uVar82;
                auVar84._4_4_ =
                     ((int)uVar86 < (int)uVar92) * uVar92 | ((int)uVar86 >= (int)uVar92) * uVar86;
                auVar84._8_4_ =
                     ((int)uVar87 < (int)uVar93) * uVar93 | ((int)uVar87 >= (int)uVar93) * uVar87;
                auVar84._12_4_ =
                     ((int)uVar89 < (int)uVar94) * uVar94 | ((int)uVar89 >= (int)uVar94) * uVar89;
                uVar82 = (uint)((int)fVar64 < (int)fVar26) * (int)fVar26 |
                         (uint)((int)fVar64 >= (int)fVar26) * (int)fVar64;
                uVar86 = (uint)((int)fVar66 < (int)fVar36) * (int)fVar36 |
                         (uint)((int)fVar66 >= (int)fVar36) * (int)fVar66;
                uVar87 = (uint)((int)fVar67 < (int)fVar37) * (int)fVar37 |
                         (uint)((int)fVar67 >= (int)fVar37) * (int)fVar67;
                uVar89 = (uint)((int)fVar68 < (int)fVar38) * (int)fVar38 |
                         (uint)((int)fVar68 >= (int)fVar38) * (int)fVar68;
                uVar90 = (uint)((int)fVar77 < (int)fVar52) * (int)fVar52 |
                         (uint)((int)fVar77 >= (int)fVar52) * (int)fVar77;
                uVar92 = (uint)((int)fVar79 < (int)fVar54) * (int)fVar54 |
                         (uint)((int)fVar79 >= (int)fVar54) * (int)fVar79;
                uVar93 = (uint)((int)fVar80 < (int)fVar56) * (int)fVar56 |
                         (uint)((int)fVar80 >= (int)fVar56) * (int)fVar80;
                uVar94 = (uint)((int)fVar81 < (int)fVar58) * (int)fVar58 |
                         (uint)((int)fVar81 >= (int)fVar58) * (int)fVar81;
                uVar90 = ((int)uVar82 < (int)uVar90) * uVar82 |
                         ((int)uVar82 >= (int)uVar90) * uVar90;
                uVar92 = ((int)uVar86 < (int)uVar92) * uVar86 |
                         ((int)uVar86 >= (int)uVar92) * uVar92;
                uVar93 = ((int)uVar87 < (int)uVar93) * uVar87 |
                         ((int)uVar87 >= (int)uVar93) * uVar93;
                uVar94 = ((int)uVar89 < (int)uVar94) * uVar89 |
                         ((int)uVar89 >= (int)uVar94) * uVar94;
                uVar82 = (uint)((int)fVar69 < (int)fVar59) * (int)fVar59 |
                         (uint)((int)fVar69 >= (int)fVar59) * (int)fVar69;
                uVar86 = (uint)((int)fVar73 < (int)fVar61) * (int)fVar61 |
                         (uint)((int)fVar73 >= (int)fVar61) * (int)fVar73;
                uVar87 = (uint)((int)fVar74 < (int)fVar62) * (int)fVar62 |
                         (uint)((int)fVar74 >= (int)fVar62) * (int)fVar74;
                uVar89 = (uint)((int)fVar76 < (int)fVar63) * (int)fVar63 |
                         (uint)((int)fVar76 >= (int)fVar63) * (int)fVar76;
                uVar82 = (uint)((int)local_17e8._0_4_ < (int)uVar82) * local_17e8._0_4_ |
                         ((int)local_17e8._0_4_ >= (int)uVar82) * uVar82;
                uVar86 = (uint)((int)local_17e8._4_4_ < (int)uVar86) * local_17e8._4_4_ |
                         ((int)local_17e8._4_4_ >= (int)uVar86) * uVar86;
                uVar87 = (uint)((int)fStack_17e0 < (int)uVar87) * (int)fStack_17e0 |
                         ((int)fStack_17e0 >= (int)uVar87) * uVar87;
                uVar89 = (uint)((int)fStack_17dc < (int)uVar89) * (int)fStack_17dc |
                         ((int)fStack_17dc >= (int)uVar89) * uVar89;
                bVar25 = (float)((uint)((int)auVar84._0_4_ < (int)local_1708._0_4_) *
                                 local_1708._0_4_ |
                                ((int)auVar84._0_4_ >= (int)local_1708._0_4_) * auVar84._0_4_) <=
                         (float)(((int)uVar90 < (int)uVar82) * uVar90 |
                                ((int)uVar90 >= (int)uVar82) * uVar82);
                bVar7 = (float)((uint)((int)auVar84._4_4_ < (int)local_1708._4_4_) *
                                local_1708._4_4_ |
                               ((int)auVar84._4_4_ >= (int)local_1708._4_4_) * auVar84._4_4_) <=
                        (float)(((int)uVar92 < (int)uVar86) * uVar92 |
                               ((int)uVar92 >= (int)uVar86) * uVar86);
                bVar8 = (float)((uint)((int)auVar84._8_4_ < (int)local_1708._8_4_) *
                                local_1708._8_4_ |
                               ((int)auVar84._8_4_ >= (int)local_1708._8_4_) * auVar84._8_4_) <=
                        (float)(((int)uVar93 < (int)uVar87) * uVar93 |
                               ((int)uVar93 >= (int)uVar87) * uVar87);
                bVar9 = (float)((uint)((int)auVar84._12_4_ < (int)local_1708._12_4_) *
                                local_1708._12_4_ |
                               ((int)auVar84._12_4_ >= (int)local_1708._12_4_) * auVar84._12_4_) <=
                        (float)(((int)uVar94 < (int)uVar89) * uVar94 |
                               ((int)uVar94 >= (int)uVar89) * uVar89);
                if (uVar13 == 6) {
                  fVar38 = *(float *)(uVar21 + 0xf0 + lVar19);
                  fVar52 = *(float *)(uVar21 + 0x100 + lVar19);
                  bVar25 = (fVar38 <= fVar45 && fVar45 < fVar52) && bVar25;
                  bVar7 = (fVar38 <= fVar48 && fVar48 < fVar52) && bVar7;
                  bVar8 = (fVar38 <= fVar49 && fVar49 < fVar52) && bVar8;
                  bVar9 = (fVar38 <= fVar50 && fVar50 < fVar52) && bVar9;
                }
                auVar29._0_4_ = (-(uint)bVar25 & -(uint)(fVar85 < (float)local_17e8._0_4_)) << 0x1f;
                auVar29._4_4_ = (-(uint)bVar7 & -(uint)(fVar88 < (float)local_17e8._4_4_)) << 0x1f;
                auVar29._8_4_ = (-(uint)bVar8 & -(uint)(fVar41 < fStack_17e0)) << 0x1f;
                auVar29._12_4_ = (-(uint)bVar9 & -(uint)(fVar42 < fStack_17dc)) << 0x1f;
                uVar82 = movmskps((int)context,auVar29);
                context = (RayQueryContext *)(ulong)uVar82;
                if (uVar82 != 0) {
                  aVar46.v = (__m128)blendvps(_DAT_01f7a9f0,auVar84,auVar29);
                  auVar30._4_4_ = -(uint)(aVar46.v[1] < aVar40.v[1]);
                  auVar30._0_4_ = -(uint)(aVar46.v[0] < aVar40.v[0]);
                  auVar30._8_4_ = -(uint)(aVar46.v[2] < aVar40.v[2]);
                  auVar30._12_4_ = -(uint)(aVar46.v[3] < aVar40.v[3]);
                  iVar12 = movmskps(uVar82,auVar30);
                  pRVar20 = pRVar22;
                  context = pRVar6;
                  aVar31 = aVar46;
                  if ((iVar12 == 0) ||
                     (bVar25 = pRVar22 != (RayQueryContext *)0x8, pRVar20 = pRVar6,
                     context = pRVar22, pRVar22 = pRVar6, aVar31 = aVar40, aVar40 = aVar46, bVar25))
                  {
                    aVar46 = aVar40;
                    uVar17 = uVar17 + 1;
                    pNVar23->ptr = (size_t)context;
                    pNVar23 = pNVar23 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18->v = aVar31;
                    paVar18 = paVar18 + 1;
                    pRVar22 = pRVar20;
                  }
                }
                lVar19 = lVar19 + 4;
                aVar40 = aVar46;
              } while (lVar19 != 0);
              auVar111._8_4_ = uVar13;
              auVar111._0_8_ = uVar17;
              auVar111._12_4_ = 0;
              if (pRVar22 == (RayQueryContext *)0x8) goto LAB_00241ab3;
              if (1 < uVar17) {
                auVar65 = *(undefined1 (*) [16])paVar18[-2].v;
                auVar32 = *(undefined1 (*) [16])paVar18[-1].v;
                auVar43._4_4_ = -(uint)(auVar65._4_4_ < auVar32._4_4_);
                auVar43._0_4_ = -(uint)(auVar65._0_4_ < auVar32._0_4_);
                auVar43._8_4_ = -(uint)(auVar65._8_4_ < auVar32._8_4_);
                auVar43._12_4_ = -(uint)(auVar65._12_4_ < auVar32._12_4_);
                uVar13 = movmskps(uVar13,auVar43);
                uVar14 = (ulong)uVar13;
                auVar71 = auVar32;
                if (uVar13 != 0) {
                  *(undefined1 (*) [16])paVar18[-2].v = auVar32;
                  *(undefined1 (*) [16])paVar18[-1].v = auVar65;
                  auVar71 = *(undefined1 (*) [16])(pNVar23 + -2);
                  auVar44._0_8_ = auVar71._8_8_;
                  auVar44._8_4_ = auVar71._0_4_;
                  auVar44._12_4_ = auVar71._4_4_;
                  *(undefined1 (*) [16])(pNVar23 + -2) = auVar44;
                  auVar71 = auVar65;
                  auVar65 = auVar32;
                }
                if (uVar17 != 2) {
                  auVar32 = *(undefined1 (*) [16])paVar18[-3].v;
                  auVar10._4_4_ = -(uint)(auVar32._4_4_ < auVar71._4_4_);
                  auVar10._0_4_ = -(uint)(auVar32._0_4_ < auVar71._0_4_);
                  auVar10._8_4_ = -(uint)(auVar32._8_4_ < auVar71._8_4_);
                  auVar10._12_4_ = -(uint)(auVar32._12_4_ < auVar71._12_4_);
                  uVar13 = movmskps((int)uVar17,auVar10);
                  uVar17 = (ulong)uVar13;
                  if (uVar13 != 0) {
                    *(undefined1 (*) [16])paVar18[-3].v = auVar71;
                    *(undefined1 (*) [16])paVar18[-1].v = auVar32;
                    uVar17 = pNVar23[-3].ptr;
                    uVar14 = pNVar23[-1].ptr;
                    pNVar23[-3].ptr = uVar14;
                    pNVar23[-1].ptr = uVar17;
                    auVar32 = auVar71;
                  }
                  auVar47._4_4_ = -(uint)(auVar32._4_4_ < auVar65._4_4_);
                  auVar47._0_4_ = -(uint)(auVar32._0_4_ < auVar65._0_4_);
                  auVar47._8_4_ = -(uint)(auVar32._8_4_ < auVar65._8_4_);
                  auVar47._12_4_ = -(uint)(auVar32._12_4_ < auVar65._12_4_);
                  uVar13 = movmskps((int)uVar17,auVar47);
                  uVar17 = (ulong)uVar13;
                  if (uVar13 != 0) {
                    *(undefined1 (*) [16])paVar18[-3].v = auVar65;
                    *(undefined1 (*) [16])paVar18[-2].v = auVar32;
                    auVar65 = *(undefined1 (*) [16])(pNVar23 + -3);
                    auVar33._0_8_ = auVar65._8_8_;
                    auVar33._8_4_ = auVar65._0_4_;
                    auVar33._12_4_ = auVar65._4_4_;
                    *(undefined1 (*) [16])(pNVar23 + -3) = auVar33;
                  }
                }
              }
            }
            if (pRVar22 == (RayQueryContext *)&DAT_fffffffffffffff8) {
              return;
            }
            auVar34._4_4_ = -(uint)(fVar88 < (float)local_17e8._4_4_);
            auVar34._0_4_ = -(uint)(fVar85 < (float)local_17e8._0_4_);
            auVar34._8_4_ = -(uint)(fVar41 < fStack_17e0);
            auVar34._12_4_ = -(uint)(fVar42 < fStack_17dc);
            uVar13 = movmskps((int)uVar17,auVar34);
            auVar111._4_4_ = 0;
            auVar111._0_4_ = uVar13;
            auVar111._8_8_ = uVar14;
            if (uVar13 != 0) {
              lVar19 = (ulong)((uint)pRVar22 & 0xf) - 8;
              auVar111._0_8_ = lVar19;
              if (lVar19 != 0) {
                lVar24 = 0;
                do {
                  local_1774 = *(uint *)(((ulong)pRVar22 & 0xfffffffffffffff0) + lVar24 * 8);
                  local_1770 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + (ulong)local_1774 * 8);
                  uVar13 = *(uint *)(local_1770 + 0x34);
                  auVar35._0_4_ = -(uint)((uVar13 & *(uint *)&(This->intersector8).occluded) == 0);
                  auVar35._4_4_ =
                       -(uint)((uVar13 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
                  auVar35._8_4_ = -(uint)((uVar13 & *(uint *)&(This->intersector8).name) == 0);
                  auVar35._12_4_ =
                       -(uint)((uVar13 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
                  mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)(~auVar35 & auVar34);
                  iVar12 = movmskps((int)uVar14,(undefined1  [16])mask.field_0);
                  auVar111._8_4_ = iVar12;
                  auVar111._0_8_ = local_1770;
                  auVar111._12_4_ = 0;
                  if (iVar12 != 0) {
                    local_1790 = *(undefined4 *)
                                  (((ulong)pRVar22 & 0xfffffffffffffff0) + 4 + lVar24 * 8);
                    local_17a0 = &mask;
                    local_1798 = *(undefined8 *)(local_1770 + 0x18);
                    local_1788 = *(undefined8 *)(ray + 8);
                    local_1778 = 4;
                    local_1768 = 0;
                    local_1760 = *(long *)(ray + 0x10);
                    pcVar15 = *(code **)(local_1760 + 0x18);
                    if (pcVar15 == (code *)0x0) {
                      pcVar15 = *(code **)(local_1770 + 0x60);
                    }
                    local_1780 = This;
                    auVar111 = (*pcVar15)(&local_17a0);
                    fVar51 = local_1758;
                    fVar53 = fStack_1754;
                    fVar55 = fStack_1750;
                    fVar57 = fStack_174c;
                    fVar72 = local_1748;
                    fVar75 = fStack_1744;
                    fVar96 = fStack_1740;
                    fVar97 = fStack_173c;
                    fVar98 = local_1718;
                    fVar100 = fStack_1714;
                    fVar101 = fStack_1710;
                    fVar102 = fStack_170c;
                    fVar103 = local_1728;
                    fVar104 = fStack_1724;
                    fVar105 = fStack_1720;
                    fVar106 = fStack_171c;
                    fVar107 = local_1738;
                    fVar108 = fStack_1734;
                    fVar109 = fStack_1730;
                    fVar110 = fStack_172c;
                  }
                  uVar14 = auVar111._8_8_;
                  lVar24 = lVar24 + 1;
                } while (lVar19 != lVar24);
              }
              _local_17e8 = blendvps(_local_17e8,
                                     *(undefined1 (*) [16])&(This->intersector4_nofilter).name,
                                     auVar34);
            }
          }
LAB_00241ab3:
          pRVar22 = (RayQueryContext *)pNVar23[-1].ptr;
          pNVar23 = pNVar23 + -1;
        } while (pRVar22 != (RayQueryContext *)0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }